

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeRecordSet.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::AttributeRecordSet::operator==(AttributeRecordSet *this,AttributeRecordSet *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = EntityIdentifier::operator!=(&this->m_EntityID,&Value->m_EntityID);
  if ((KVar1) || (this->m_ui16NumAttrRecs != Value->m_ui16NumAttrRecs)) {
    bVar2 = false;
  }
  else {
    bVar2 = std::operator!=(&this->m_vAttrRec,&Value->m_vAttrRec);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

KBOOL AttributeRecordSet::operator == ( const AttributeRecordSet & Value ) const
{
    if( m_EntityID        != Value.m_EntityID )        return false;
    if( m_ui16NumAttrRecs != Value.m_ui16NumAttrRecs ) return false;
    if( m_vAttrRec        != Value.m_vAttrRec )		   return false;
    return true;
}